

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O2

bool __thiscall slang::SourceManager::isMacroArgLoc(SourceManager *this,SourceLocation location)

{
  pointer pvVar1;
  undefined1 uVar2;
  ulong uVar3;
  shared_lock<std::shared_mutex> lock;
  
  uVar3 = (ulong)location & 0xfffffff;
  uVar2 = 0;
  if ((uVar3 != 0) && (uVar2 = 0, location != (SourceLocation)0xffffffffffffffff)) {
    lock._M_owns = true;
    lock._M_pm = &this->mut;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
    pvVar1 = (this->bufferEntries).
             super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->bufferEntries).
                       super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x38) <= uVar3)
    {
      assert::assertFailed
                ("buffer.getId() < bufferEntries.size()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/text/SourceManager.cpp"
                 ,0xa3,"bool slang::SourceManager::isMacroArgLoc(SourceLocation) const");
    }
    uVar2 = 0;
    if ((pvVar1 != (pointer)0x0) &&
       (uVar2 = 0,
       *(__index_type *)
        ((long)&pvVar1[uVar3].
                super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                .
                super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
        + 0x30) == '\x01')) {
      uVar2 = *(undefined1 *)
               ((long)&pvVar1[uVar3].
                       super__Variant_base<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Move_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                       .
                       super__Copy_assign_alias<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
               + 0x18);
    }
    std::shared_lock<std::shared_mutex>::~shared_lock(&lock);
  }
  return (bool)uVar2;
}

Assistant:

bool SourceManager::isMacroArgLoc(SourceLocation location) const {
    if (location == SourceLocation::NoLocation)
        return false;

    auto buffer = location.buffer();
    if (!buffer)
        return false;

    std::shared_lock lock(mut);

    ASSERT(buffer.getId() < bufferEntries.size());
    auto info = std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]);
    return info && info->isMacroArg;
}